

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp5::groebnerRow23_00000_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  double factor;
  Index in_stack_fffffffffffffe98;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *in_stack_fffffffffffffea0;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,0x9be210);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be231);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be25e);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be28c);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be2b0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *pSVar2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar24,auVar44);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be306);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be32a);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *pSVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar25,auVar45);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be380);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be3a4);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *pSVar2;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar26,auVar46);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be3fa);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be41e);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *pSVar2;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar27,auVar47);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be474);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be498);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *pSVar2;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar28,auVar48);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be4ee);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be512);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *pSVar2;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar29,auVar49);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be568);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be58c);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *pSVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar30,auVar50);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be5e5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be60c);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *pSVar2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar31,auVar51);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be66b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be692);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SVar1;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *pSVar2;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar12,auVar32,auVar52);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be6f1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be718);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SVar1;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *pSVar2;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar13,auVar33,auVar53);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be777);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be79e);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = SVar1;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *pSVar2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar14,auVar34,auVar54);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be7fd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be824);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SVar1;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *pSVar2;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar15,auVar35,auVar55);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be883);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be8aa);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = SVar1;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *pSVar2;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar16,auVar36,auVar56);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be909);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be930);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = SVar1;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *pSVar2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar17,auVar37,auVar57);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be98f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9be9b6);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = SVar1;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *pSVar2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar18,auVar38,auVar58);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9bea15);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9bea3c);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = SVar1;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *pSVar2;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar19,auVar39,auVar59);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9bea9b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9beac2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = SVar1;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *pSVar2;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar20,auVar40,auVar60);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9beb21);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9beb48);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = SVar1;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *pSVar2;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar21,auVar41,auVar61);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9beba7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9bebce);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = SVar1;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *pSVar2;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar22,auVar42,auVar62);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9bec2d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffe98,0x9bec54);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = SVar1;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *pSVar2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar23,auVar43,auVar63);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow23_00000_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,25) / groebnerMatrix(23,25);
  groebnerMatrix(targetRow,25) = 0.0;
  groebnerMatrix(targetRow,54) -= factor * groebnerMatrix(23,54);
  groebnerMatrix(targetRow,55) -= factor * groebnerMatrix(23,55);
  groebnerMatrix(targetRow,56) -= factor * groebnerMatrix(23,56);
  groebnerMatrix(targetRow,57) -= factor * groebnerMatrix(23,57);
  groebnerMatrix(targetRow,58) -= factor * groebnerMatrix(23,58);
  groebnerMatrix(targetRow,65) -= factor * groebnerMatrix(23,65);
  groebnerMatrix(targetRow,66) -= factor * groebnerMatrix(23,66);
  groebnerMatrix(targetRow,67) -= factor * groebnerMatrix(23,67);
  groebnerMatrix(targetRow,68) -= factor * groebnerMatrix(23,68);
  groebnerMatrix(targetRow,69) -= factor * groebnerMatrix(23,69);
  groebnerMatrix(targetRow,70) -= factor * groebnerMatrix(23,70);
  groebnerMatrix(targetRow,71) -= factor * groebnerMatrix(23,71);
  groebnerMatrix(targetRow,72) -= factor * groebnerMatrix(23,72);
  groebnerMatrix(targetRow,73) -= factor * groebnerMatrix(23,73);
  groebnerMatrix(targetRow,74) -= factor * groebnerMatrix(23,74);
  groebnerMatrix(targetRow,75) -= factor * groebnerMatrix(23,75);
  groebnerMatrix(targetRow,76) -= factor * groebnerMatrix(23,76);
  groebnerMatrix(targetRow,77) -= factor * groebnerMatrix(23,77);
  groebnerMatrix(targetRow,78) -= factor * groebnerMatrix(23,78);
  groebnerMatrix(targetRow,79) -= factor * groebnerMatrix(23,79);
}